

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_WriteLibrary(FILE *pFile,Mio_Library_t *pLib,int fPrintSops,int fShort,int fSelected)

{
  char *pcVar1;
  Mio_Library_t *__stream;
  int iVar2;
  int iVar3;
  uint uVar4;
  Mio_Cell2_t *__ptr;
  size_t sVar5;
  char *pcVar6;
  bool local_61;
  Mio_Cell2_t *pCells;
  int fAllPins;
  int FormLen;
  int NameLen;
  int GateLen;
  int nCells;
  int i;
  Vec_Ptr_t *vGates;
  Mio_Pin_t *pPin;
  Mio_Gate_t *pGate;
  int local_20;
  int fSelected_local;
  int fShort_local;
  int fPrintSops_local;
  Mio_Library_t *pLib_local;
  FILE *pFile_local;
  
  pGate._4_4_ = fSelected;
  local_20 = fShort;
  fSelected_local = fPrintSops;
  _fShort_local = pLib;
  pLib_local = (Mio_Library_t *)pFile;
  _nCells = Vec_PtrAlloc(1000);
  FormLen = 0;
  fAllPins = 0;
  pCells._4_4_ = 0;
  local_61 = true;
  if (local_20 == 0) {
    iVar2 = Mio_CheckGates(_fShort_local);
    local_61 = iVar2 != 0;
  }
  if (pGate._4_4_ == 0) {
    for (GateLen = 0; GateLen < _fShort_local->nGates; GateLen = GateLen + 1) {
      Vec_PtrPush(_nCells,_fShort_local->ppGates0[GateLen]);
    }
  }
  else {
    __ptr = Mio_CollectRootsNewDefault2(6,&NameLen,0);
    for (GateLen = 0; GateLen < NameLen; GateLen = GateLen + 1) {
      Vec_PtrPush(_nCells,__ptr[GateLen].pMioGate);
    }
    if (__ptr != (Mio_Cell2_t *)0x0) {
      free(__ptr);
    }
  }
  for (GateLen = 0; iVar2 = GateLen, iVar3 = Vec_PtrSize(_nCells), __stream = pLib_local,
      iVar2 < iVar3; GateLen = GateLen + 1) {
    pPin = (Mio_Pin_t *)Vec_PtrEntry(_nCells,GateLen);
    sVar5 = strlen(pPin->pName);
    FormLen = Abc_MaxInt(FormLen,(int)sVar5);
    sVar5 = strlen((char *)pPin->dDelayBlockRise);
    fAllPins = Abc_MaxInt(fAllPins,(int)sVar5);
    sVar5 = strlen((char *)pPin->dLoadInput);
    pCells._4_4_ = Abc_MaxInt(pCells._4_4_,(int)sVar5);
    for (vGates = (Vec_Ptr_t *)Mio_GateReadPins((Mio_Gate_t *)pPin); vGates != (Vec_Ptr_t *)0x0;
        vGates = (Vec_Ptr_t *)Mio_PinReadNext((Mio_Pin_t *)vGates)) {
      sVar5 = strlen(*(char **)vGates);
      fAllPins = Abc_MaxInt(fAllPins,(int)sVar5);
    }
  }
  pcVar1 = _fShort_local->pName;
  uVar4 = Vec_PtrSize(_nCells);
  pcVar6 = Extra_TimeStamp();
  fprintf((FILE *)__stream,"# The genlib library \"%s\" with %d gates written by ABC on %s\n",pcVar1
          ,(ulong)uVar4,pcVar6);
  for (GateLen = 0; iVar2 = GateLen, iVar3 = Vec_PtrSize(_nCells), iVar2 < iVar3;
      GateLen = GateLen + 1) {
    pPin = (Mio_Pin_t *)Vec_PtrEntry(_nCells,GateLen);
    Mio_WriteGate((FILE *)pLib_local,(Mio_Gate_t *)pPin,FormLen,fAllPins,pCells._4_4_,
                  fSelected_local,(uint)local_61);
  }
  Vec_PtrFree(_nCells);
  return;
}

Assistant:

void Mio_WriteLibrary( FILE * pFile, Mio_Library_t * pLib, int fPrintSops, int fShort, int fSelected )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pPin;
    Vec_Ptr_t * vGates = Vec_PtrAlloc( 1000 );
    int i, nCells, GateLen = 0, NameLen = 0, FormLen = 0;
    int fAllPins = fShort || Mio_CheckGates( pLib );
    if ( fSelected )
    {
        Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
        for ( i = 0; i < nCells; i++ )
            Vec_PtrPush( vGates, pCells[i].pMioGate );
        ABC_FREE( pCells );
    }
    else
    {
        for ( i = 0; i < pLib->nGates; i++ )
            Vec_PtrPush( vGates, pLib->ppGates0[i] );
    }
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
    {
        GateLen = Abc_MaxInt( GateLen, strlen(pGate->pName) );
        NameLen = Abc_MaxInt( NameLen, strlen(pGate->pOutName) );
        FormLen = Abc_MaxInt( FormLen, strlen(pGate->pForm) );
        Mio_GateForEachPin( pGate, pPin )
            NameLen = Abc_MaxInt( NameLen, strlen(pPin->pName) );
    }
    fprintf( pFile, "# The genlib library \"%s\" with %d gates written by ABC on %s\n", pLib->pName, Vec_PtrSize(vGates), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
        Mio_WriteGate( pFile, pGate, GateLen, NameLen, FormLen, fPrintSops, fAllPins );
    Vec_PtrFree( vGates );
}